

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

CheckedError __thiscall
flatbuffers::Parser::ParseSingleValue(Parser *this,string *name,Value *e,bool check_now)

{
  size_type *psVar1;
  bool bVar2;
  Value *pVVar3;
  CheckedError CVar4;
  int iVar5;
  undefined4 uVar6;
  int iVar7;
  int iVar8;
  undefined8 in_RAX;
  long *plVar9;
  undefined8 *puVar10;
  bool check;
  undefined1 check_00;
  undefined7 in_register_00000009;
  string *result;
  long *plVar11;
  char *pcVar12;
  ulong *puVar13;
  long lVar14;
  ulong uVar15;
  _Alloc_hider _Var16;
  byte in_R8B;
  BaseType req;
  uint uVar17;
  byte bVar18;
  bool *destmatch;
  double val;
  size_type local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  uint local_124;
  Value *local_120;
  undefined4 local_118;
  allocator<char> local_111;
  uint local_110;
  byte local_10c;
  ulong *local_108;
  long local_100;
  ulong local_f8;
  long lStack_f0;
  ulong *local_e8;
  long local_e0;
  ulong local_d8 [2];
  long *local_c8;
  undefined8 local_c0;
  long local_b8;
  undefined8 uStack_b0;
  string *local_a8;
  long local_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  result = (string *)CONCAT71(in_register_00000009,check_now);
  iVar8 = *(int *)((long)&name->field_2 + 0xc);
  local_10c = in_R8B;
  if ((iVar8 == 0x2d) || (iVar8 == 0x2b)) {
    Next(this);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010e6d8;
    if (*(int *)((long)&name->field_2 + 0xc) == 0x104) {
      in_RAX = std::__cxx11::string::insert((ulong)&name[1]._M_string_length,0,'\x01');
      iVar8 = *(int *)((long)&name->field_2 + 0xc);
      goto LAB_0010d82c;
    }
    val = (double)&local_138;
    std::__cxx11::string::_M_construct<char_const*>((string *)&val,"constant name expected","");
    Error(this,name);
LAB_0010e202:
    local_58.field_2._M_allocated_capacity = local_138._M_allocated_capacity;
    _Var16._M_p = (pointer)val;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)val == &local_138) goto LAB_0010e6d8;
  }
  else {
LAB_0010d82c:
    iVar5 = *(int *)&(result->_M_dataplus)._M_p;
    lVar14 = (long)iVar5;
    req = (BaseType)result;
    if (iVar8 == 0x104) {
      if (*(char *)name->_M_string_length == '(') {
        ParseFunction(this,name,e);
        goto LAB_0010e6d8;
      }
      uVar6 = (int)CONCAT71((int7)((ulong)name->_M_string_length >> 8),iVar5 == 0xd);
LAB_0010d90c:
      local_124 = CONCAT31(local_124._1_3_,iVar5 - 1U < 0xc);
      goto LAB_0010d91b;
    }
    bVar2 = false;
    iVar7 = (int)e;
    if (iVar8 != 0x101) {
      if (iVar5 - 0xbU < 2 && iVar8 == 0x103) {
        TryTypedValue(this,name,iVar7,true,(Value *)0x1,req,(bool *)0xb);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010e6d8;
        iVar8 = *(int *)((long)&name->field_2 + 0xc);
      }
      if (iVar8 == 0x102) {
        bVar18 = iVar5 - 1U < 0xc;
        check_00 = 2;
        destmatch = (bool *)0x7;
LAB_0010dd73:
        bVar2 = false;
        TryTypedValue(this,name,iVar7,(bool)check_00,(Value *)(ulong)bVar18,req,destmatch);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010e6d8;
      }
LAB_0010ddef:
      if (((bVar2) || ((*(int *)&(result->_M_dataplus)._M_p - 0xeU & 0xfffffffb) != 0)) ||
         (*(int *)((long)&name->field_2 + 0xc) != 0x5b)) {
        if (!bVar2) {
          val = (double)&local_138;
          local_140 = 0;
          local_138._M_allocated_capacity = local_138._M_allocated_capacity & 0xffffffffffffff00;
          TokenToStringId_abi_cxx11_(&local_58,(Parser *)name,*(int *)((long)&name->field_2 + 0xc));
          plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x1b1bdd);
          plVar11 = plVar9 + 2;
          if ((long *)*plVar9 == plVar11) {
            local_88 = *plVar11;
            lStack_80 = plVar9[3];
            local_98 = &local_88;
          }
          else {
            local_88 = *plVar11;
            local_98 = (long *)*plVar9;
          }
          local_90 = plVar9[1];
          *plVar9 = (long)plVar11;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_98);
          puVar13 = (ulong *)(plVar9 + 2);
          if ((ulong *)*plVar9 == puVar13) {
            local_f8 = *puVar13;
            lStack_f0 = plVar9[3];
            local_108 = &local_f8;
          }
          else {
            local_f8 = *puVar13;
            local_108 = (ulong *)*plVar9;
          }
          local_100 = plVar9[1];
          *plVar9 = (long)puVar13;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          if (0x12 < (uint)lVar14) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/idl.h"
                          ,0xaa,"const char *flatbuffers::TypeName(const BaseType)");
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e8,*(char **)(&DAT_001fbc80 + lVar14 * 8),&local_111);
          uVar15 = 0xf;
          if (local_108 != &local_f8) {
            uVar15 = local_f8;
          }
          if (uVar15 < (ulong)(local_e0 + local_100)) {
            uVar15 = 0xf;
            if (local_e8 != local_d8) {
              uVar15 = local_d8[0];
            }
            if (uVar15 < (ulong)(local_e0 + local_100)) goto LAB_0010e04f;
            puVar10 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,(ulong)local_108)
            ;
          }
          else {
LAB_0010e04f:
            puVar10 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_e8);
          }
          local_c8 = &local_b8;
          plVar9 = puVar10 + 2;
          if ((long *)*puVar10 == plVar9) {
            local_b8 = *plVar9;
            uStack_b0 = puVar10[3];
          }
          else {
            local_b8 = *plVar9;
            local_c8 = (long *)*puVar10;
          }
          local_c0 = puVar10[1];
          *puVar10 = plVar9;
          puVar10[1] = 0;
          *(undefined1 *)plVar9 = 0;
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_c8);
          plVar11 = plVar9 + 2;
          if ((long *)*plVar9 == plVar11) {
            local_68 = *plVar11;
            lStack_60 = plVar9[3];
            local_78 = &local_68;
          }
          else {
            local_68 = *plVar11;
            local_78 = (long *)*plVar9;
          }
          local_70 = plVar9[1];
          *plVar9 = (long)plVar11;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&val,(ulong)local_78);
          if (local_78 != &local_68) {
            operator_delete(local_78,local_68 + 1);
          }
          if (local_c8 != &local_b8) {
            operator_delete(local_c8,local_b8 + 1);
          }
          if (local_e8 != local_d8) {
            operator_delete(local_e8,local_d8[0] + 1);
          }
          if (local_108 != &local_f8) {
            operator_delete(local_108,local_f8 + 1);
          }
          if (local_98 != &local_88) {
            operator_delete(local_98,local_88 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          Error(this,name);
          goto LAB_0010e202;
        }
      }
      else {
        Next(this);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010e6d8;
        if (*(int *)((long)&name->field_2 + 0xc) != 0x5d) {
          val = (double)&local_138;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&val,"Expected `]` in vector default","");
          Error(this,name);
          goto LAB_0010e202;
        }
        Next(this);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010e6d8;
        std::__cxx11::string::operator=((string *)(result + 1),"[]");
      }
      uVar17 = *(int *)&(result->_M_dataplus)._M_p - 1;
      if (((uVar17 < 0xc & local_10c) == 1) &&
         (iVar8 = std::__cxx11::string::compare((char *)(result + 1)), iVar8 != 0)) {
        CVar4 = (CheckedError)
                (*(code *)(&DAT_001b0088 + *(int *)(&DAT_001b0088 + (ulong)uVar17 * 4)))();
        return CVar4;
      }
      *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
      goto LAB_0010e6d8;
    }
    if (iVar5 == 0xd) {
      local_118 = (undefined4)CONCAT71((int7)((ulong)in_RAX >> 8),iVar5 == 0xd);
      TryTypedValue(this,name,iVar7,true,(Value *)0x1,req,(bool *)0xd);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      uVar6 = local_118;
      if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010e6d8;
      goto LAB_0010d90c;
    }
    local_110 = iVar5 - 1;
    local_124 = CONCAT31(local_124._1_3_,local_110 < 0xc);
    if (local_110 >= 0xc) {
      uVar6 = 0;
LAB_0010d91b:
      bVar2 = false;
      local_110 = iVar5 - 1;
      check = SUB41(iVar8,0);
      local_120 = e;
      local_118 = uVar6;
      local_a0 = lVar14;
      if (iVar5 == 2) {
        psVar1 = &name[1]._M_string_length;
        iVar5 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar5 == 0) {
          pcVar12 = "1";
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)psVar1);
          lVar14 = local_a0;
          if (iVar5 != 0) goto LAB_0010db3b;
          pcVar12 = "0";
        }
        std::__cxx11::string::_M_replace
                  ((ulong)psVar1,0,(char *)name[1].field_2._M_allocated_capacity,(ulong)pcVar12);
        lVar14 = local_a0;
        if (iVar8 == *(int *)((long)&name->field_2 + 0xc)) {
          TryTypedValue(this,name,(int)local_120,check,(Value *)0x1,req,(bool *)0x2);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010e6d8;
        }
      }
LAB_0010db3b:
      iVar5 = (int)lVar14;
      if ((iVar5 - 0xdU < 0xfffffff4) ||
         (iVar7 = std::__cxx11::string::compare((char *)&name[1]._M_string_length), iVar7 != 0)) {
        uVar17 = iVar5 - 0xb;
        local_a8 = result;
        if (((iVar5 == 2) || (uVar17 < 0xfffffff6)) ||
           (((int)*(char *)name[1]._M_string_length != 0x5f &&
            (0x19 < ((int)*(char *)name[1]._M_string_length & 0xffffffdfU) - 0x41)))) {
          if ((iVar8 == 0x101 & (byte)local_124) == 1) {
            psVar1 = &name[1]._M_string_length;
            local_124 = uVar17;
            lVar14 = std::__cxx11::string::find_last_not_of((char)psVar1,0x20);
            if (lVar14 != -1) {
              std::__cxx11::string::resize((ulong)psVar1,(char)lVar14 + '\x01');
            }
            uVar17 = local_124;
            local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar1;
            if ((*(int *)&(local_a8->_M_dataplus)._M_p - 0xbU < 2) &&
               (lVar14 = std::__cxx11::string::rfind((char)psVar1,0x29), lVar14 != -1)) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &val,"invalid number: ",local_38);
              Error(this,name);
              local_58.field_2._M_allocated_capacity = local_138._M_allocated_capacity;
              _Var16._M_p = (pointer)val;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)val == &local_138) goto LAB_0010e6d8;
              goto LAB_0010e215;
            }
          }
          result = local_a8;
          iVar5 = *(int *)((long)&name->field_2 + 0xc);
          req = (BaseType)local_a8;
          if (uVar17 < 2 && iVar8 == iVar5) {
            TryTypedValue(this,name,(int)local_120,check,(Value *)0x1,req,(bool *)0xb);
            *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010e6d8;
            iVar5 = *(int *)((long)&name->field_2 + 0xc);
          }
          lVar14 = local_a0;
          if ((iVar8 == iVar5) && (local_110 < 10)) {
            TryTypedValue(this,name,(int)local_120,check,(Value *)0x1,req,(bool *)0x7);
            *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010e6d8;
            iVar5 = *(int *)((long)&name->field_2 + 0xc);
          }
          iVar7 = (int)local_120;
          if (iVar5 == 0x101) {
            check_00 = true;
            destmatch = (bool *)0xd;
            bVar18 = (byte)local_118;
            goto LAB_0010dd73;
          }
          goto LAB_0010ddef;
        }
        ParseEnumFromString(this,(Type *)name,result);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010e6d8;
      }
      else {
        std::__cxx11::string::_M_replace
                  ((ulong)(result + 1),0,(char *)result[1]._M_string_length,0x1b0e51);
      }
      Next(this);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010e6d8;
      bVar2 = true;
      goto LAB_0010ddef;
    }
    uVar6 = 0;
    if (*(char *)&name[1]._M_dataplus._M_p != '\0') goto LAB_0010d91b;
    local_120 = e;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,
               "type mismatch or invalid value, an initializer of non-string field must be trivial ASCII string: type: "
               ,"");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_58);
    pVVar3 = local_120;
    local_98 = &local_88;
    plVar11 = plVar9 + 2;
    if ((long *)*plVar9 == plVar11) {
      local_88 = *plVar11;
      lStack_80 = plVar9[3];
    }
    else {
      local_88 = *plVar11;
      local_98 = (long *)*plVar9;
    }
    local_90 = plVar9[1];
    *plVar9 = (long)plVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_98);
    local_108 = &local_f8;
    puVar13 = (ulong *)(plVar9 + 2);
    if ((ulong *)*plVar9 == puVar13) {
      local_f8 = *puVar13;
      lStack_f0 = plVar9[3];
    }
    else {
      local_f8 = *puVar13;
      local_108 = (ulong *)*plVar9;
    }
    local_100 = plVar9[1];
    *plVar9 = (long)puVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    local_e8 = local_d8;
    if (pVVar3 == (Value *)0x0) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
    }
    else {
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e8,*(long *)&pVVar3->type,
                 (long)&(((pVVar3->type).struct_def)->super_Definition).name._M_dataplus._M_p +
                 *(long *)&pVVar3->type);
    }
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_e8);
    plVar9 = puVar10 + 2;
    if ((long *)*puVar10 == plVar9) {
      local_b8 = *plVar9;
      uStack_b0 = puVar10[3];
      local_c8 = &local_b8;
    }
    else {
      local_b8 = *plVar9;
      local_c8 = (long *)*puVar10;
    }
    local_c0 = puVar10[1];
    *puVar10 = plVar9;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_c8);
    plVar11 = plVar9 + 2;
    if ((long *)*plVar9 == plVar11) {
      local_68 = *plVar11;
      lStack_60 = plVar9[3];
      local_78 = &local_68;
    }
    else {
      local_68 = *plVar11;
      local_78 = (long *)*plVar9;
    }
    local_70 = plVar9[1];
    *plVar9 = (long)plVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_78,name[1]._M_string_length);
    puVar13 = (ulong *)(plVar9 + 2);
    if ((ulong *)*plVar9 == puVar13) {
      local_138._M_allocated_capacity = *puVar13;
      local_138._8_8_ = plVar9[3];
      val = (double)&local_138;
    }
    else {
      local_138._M_allocated_capacity = *puVar13;
      val = (double)*plVar9;
    }
    local_140 = plVar9[1];
    *plVar9 = (long)puVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    Error(this,name);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)val != &local_138) {
      operator_delete((void *)val,local_138._M_allocated_capacity + 1);
    }
    if (local_78 != &local_68) {
      operator_delete(local_78,local_68 + 1);
    }
    if (local_c8 != &local_b8) {
      operator_delete(local_c8,local_b8 + 1);
    }
    if (local_e8 != local_d8) {
      operator_delete(local_e8,local_d8[0] + 1);
    }
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_98 != &local_88) {
      operator_delete(local_98,local_88 + 1);
    }
    _Var16._M_p = local_58._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == &local_58.field_2) goto LAB_0010e6d8;
  }
LAB_0010e215:
  operator_delete(_Var16._M_p,local_58.field_2._M_allocated_capacity + 1);
LAB_0010e6d8:
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseSingleValue(const std::string *name, Value &e,
                                      bool check_now) {
  if (token_ == '+' || token_ == '-') {
    const char sign = static_cast<char>(token_);
    // Get an indentifier: NAN, INF, or function name like cos/sin/deg.
    NEXT();
    if (token_ != kTokenIdentifier) return Error("constant name expected");
    attribute_.insert(size_t(0), size_t(1), sign);
  }

  const auto in_type = e.type.base_type;
  const auto is_tok_ident = (token_ == kTokenIdentifier);
  const auto is_tok_string = (token_ == kTokenStringConstant);

  // First see if this could be a conversion function.
  if (is_tok_ident && *cursor_ == '(') { return ParseFunction(name, e); }

  // clang-format off
  auto match = false;

  #define IF_ECHECK_(force, dtoken, check, req)    \
    if (!match && ((dtoken) == token_) && ((check) || flatbuffers::IsConstTrue(force))) \
      ECHECK(TryTypedValue(name, dtoken, check, e, req, &match))
  #define TRY_ECHECK(dtoken, check, req) IF_ECHECK_(false, dtoken, check, req)
  #define FORCE_ECHECK(dtoken, check, req) IF_ECHECK_(true, dtoken, check, req)
  // clang-format on

  if (is_tok_ident || is_tok_string) {
    const auto kTokenStringOrIdent = token_;
    // The string type is a most probable type, check it first.
    TRY_ECHECK(kTokenStringConstant, in_type == BASE_TYPE_STRING,
               BASE_TYPE_STRING);

    // avoid escaped and non-ascii in the string
    if (!match && is_tok_string && IsScalar(in_type) &&
        !attr_is_trivial_ascii_string_) {
      return Error(
          std::string("type mismatch or invalid value, an initializer of "
                      "non-string field must be trivial ASCII string: type: ") +
          TypeName(in_type) + ", name: " + (name ? *name : "") +
          ", value: " + attribute_);
    }

    // A boolean as true/false. Boolean as Integer check below.
    if (!match && IsBool(in_type)) {
      auto is_true = attribute_ == "true";
      if (is_true || attribute_ == "false") {
        attribute_ = is_true ? "1" : "0";
        // accepts both kTokenStringConstant and kTokenIdentifier
        TRY_ECHECK(kTokenStringOrIdent, IsBool(in_type), BASE_TYPE_BOOL);
      }
    }
    // Check for optional scalars.
    if (!match && IsScalar(in_type) && attribute_ == "null") {
      e.constant = "null";
      NEXT();
      match = true;
    }
    // Check if this could be a string/identifier enum value.
    // Enum can have only true integer base type.
    if (!match && IsInteger(in_type) && !IsBool(in_type) &&
        IsIdentifierStart(*attribute_.c_str())) {
      ECHECK(ParseEnumFromString(e.type, &e.constant));
      NEXT();
      match = true;
    }
    // Parse a float/integer number from the string.
    // A "scalar-in-string" value needs extra checks.
    if (!match && is_tok_string && IsScalar(in_type)) {
      // Strip trailing whitespaces from attribute_.
      auto last_non_ws = attribute_.find_last_not_of(' ');
      if (std::string::npos != last_non_ws) attribute_.resize(last_non_ws + 1);
      if (IsFloat(e.type.base_type)) {
        // The functions strtod() and strtof() accept both 'nan' and
        // 'nan(number)' literals. While 'nan(number)' is rejected by the parser
        // as an unsupported function if is_tok_ident is true.
        if (attribute_.find_last_of(')') != std::string::npos) {
          return Error("invalid number: " + attribute_);
        }
      }
    }
    // Float numbers or nan, inf, pi, etc.
    TRY_ECHECK(kTokenStringOrIdent, IsFloat(in_type), BASE_TYPE_FLOAT);
    // An integer constant in string.
    TRY_ECHECK(kTokenStringOrIdent, IsInteger(in_type), BASE_TYPE_INT);
    // Unknown tokens will be interpreted as string type.
    // An attribute value may be a scalar or string constant.
    FORCE_ECHECK(kTokenStringConstant, in_type == BASE_TYPE_STRING,
                 BASE_TYPE_STRING);
  } else {
    // Try a float number.
    TRY_ECHECK(kTokenFloatConstant, IsFloat(in_type), BASE_TYPE_FLOAT);
    // Integer token can init any scalar (integer of float).
    FORCE_ECHECK(kTokenIntegerConstant, IsScalar(in_type), BASE_TYPE_INT);
  }
  // Match empty vectors for default-empty-vectors.
  if (!match && IsVector(e.type) && token_ == '[') {
    NEXT();
    if (token_ != ']') { return Error("Expected `]` in vector default"); }
    NEXT();
    match = true;
    e.constant = "[]";
  }

#undef FORCE_ECHECK
#undef TRY_ECHECK
#undef IF_ECHECK_

  if (!match) {
    std::string msg;
    msg += "Cannot assign token starting with '" + TokenToStringId(token_) +
           "' to value of <" + std::string(TypeName(in_type)) + "> type.";
    return Error(msg);
  }
  const auto match_type = e.type.base_type;  // may differ from in_type
  // The check_now flag must be true when parse a fbs-schema.
  // This flag forces to check default scalar values or metadata of field.
  // For JSON parser the flag should be false.
  // If it is set for JSON each value will be checked twice (see ParseTable).
  // Special case 'null' since atot can't handle that.
  if (check_now && IsScalar(match_type) && e.constant != "null") {
    // clang-format off
    switch (match_type) {
    #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, ...) \
      case BASE_TYPE_ ## ENUM: {\
          CTYPE val; \
          ECHECK(atot(e.constant.c_str(), *this, &val)); \
          SingleValueRepack(e, val); \
        break; }
    FLATBUFFERS_GEN_TYPES_SCALAR(FLATBUFFERS_TD)
    #undef FLATBUFFERS_TD
    default: break;
    }
    // clang-format on
  }
  return NoError();
}